

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplaintextedit.cpp
# Opt level: O0

void __thiscall QPlainTextEdit::keyReleaseEvent(QPlainTextEdit *this,QKeyEvent *e)

{
  bool bVar1;
  QPlainTextEditPrivate *pQVar2;
  QWidgetPrivate *in_RSI;
  QWidget *in_RDI;
  QPlainTextEditPrivate *d;
  QKeyEvent *in_stack_ffffffffffffffd8;
  undefined1 clickCausedFocus;
  
  pQVar2 = d_func((QPlainTextEdit *)0x6c55d1);
  clickCausedFocus = (undefined1)((ulong)pQVar2 >> 0x38);
  bVar1 = isReadOnly((QPlainTextEdit *)in_RDI);
  if (!bVar1) {
    QWidgetPrivate::handleSoftwareInputPanel(in_RSI,(bool)clickCausedFocus);
  }
  QWidget::keyReleaseEvent(in_RDI,in_stack_ffffffffffffffd8);
  return;
}

Assistant:

void QPlainTextEdit::keyReleaseEvent(QKeyEvent *e)
{
    Q_D(QPlainTextEdit);
    if (!isReadOnly())
        d->handleSoftwareInputPanel();

#ifdef QT_KEYPAD_NAVIGATION
    if (QApplicationPrivate::keypadNavigationEnabled()) {
        if (!e->isAutoRepeat() && e->key() == Qt::Key_Back
            && d->deleteAllTimer.isActive()) {
            d->deleteAllTimer.stop();
            QTextCursor cursor = d->control->textCursor();
            QTextBlockFormat blockFmt = cursor.blockFormat();

            QTextList *list = cursor.currentList();
            if (list && cursor.atBlockStart()) {
                list->remove(cursor.block());
            } else if (cursor.atBlockStart() && blockFmt.indent() > 0) {
                blockFmt.setIndent(blockFmt.indent() - 1);
                cursor.setBlockFormat(blockFmt);
            } else {
                cursor.deletePreviousChar();
            }
            setTextCursor(cursor);
        }
    }
#else
    QWidget::keyReleaseEvent(e);
#endif
}